

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testValidScale(void)

{
  pointer pcVar1;
  BoxCoordinatesMode *pBVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar10 = (pAVar7->shape_).current_size_;
  if (iVar10 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar10 + 1);
    iVar10 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar10 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar10] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] == 0xf5) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xf5;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    CoreML::Specification::ScaleLayerParams::ScaleLayerParams(this_01.scale_);
    (this_00->layer_).scale_ = (ScaleLayerParams *)this_01;
  }
  iVar10 = ((this_01.convolution_)->kernelsize_).current_size_;
  if (iVar10 == ((this_01.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(this_01.convolution_)->kernelsize_,iVar10 + 1);
    iVar10 = ((this_01.convolution_)->kernelsize_).current_size_;
  }
  pWVar8 = (this_01.innerproduct_)->bias_;
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar10 + 1;
  (&pWVar8->_internal_metadata_)[iVar10].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x5;
  iVar10 = 5;
  do {
    pWVar8 = (this_01.scale_)->scale_;
    if (pWVar8 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.scale_)->scale_ = pWVar8;
    }
    iVar11 = (pWVar8->floatvalue_).current_size_;
    if (iVar11 == (pWVar8->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar11 + 1);
      iVar11 = (pWVar8->floatvalue_).current_size_;
    }
    (pWVar8->floatvalue_).current_size_ = iVar11 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar11] = 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  iVar10 = ((this_01.convolution_)->stride_).current_size_;
  if (iVar10 == ((this_01.convolution_)->stride_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(this_01.convolution_)->stride_,iVar10 + 1);
    iVar10 = ((this_01.convolution_)->stride_).current_size_;
  }
  pBVar2 = (this_01.cropresize_)->boxindicesmode_;
  ((this_01.convolution_)->stride_).current_size_ = iVar10 + 1;
  (&pBVar2->_internal_metadata_)[iVar10].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x3;
  (this_01.scale_)->hasbias_ = true;
  iVar10 = 3;
  do {
    pWVar8 = (this_01.scale_)->bias_;
    if (pWVar8 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar8);
      (this_01.scale_)->bias_ = pWVar8;
    }
    iVar11 = (pWVar8->floatvalue_).current_size_;
    if (iVar11 == (pWVar8->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar8->floatvalue_,iVar11 + 1);
      iVar11 = (pWVar8->floatvalue_).current_size_;
    }
    (pWVar8->floatvalue_).current_size_ = iVar11 + 1;
    ((pWVar8->floatvalue_).rep_)->elements[iVar11] = 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar3 = CoreML::Result::good((Result *)local_80);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)!bVar3;
}

Assistant:

int testValidScale() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    params->add_shapebias(num_bias);
    params->set_hasbias(true);
    for (int i = 0; i < num_bias; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}